

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

bool __thiscall Clasp::Cli::ClaspAppBase::onSignal(ClaspAppBase *this,int sig)

{
  bool bVar1;
  int __status;
  ClaspFacade *this_00;
  double dVar2;
  
  this_00 = (ClaspFacade *)((this->clasp_).ptr_ & 0xfffffffffffffffe);
  if ((this_00 != (ClaspFacade *)0x0) && (bVar1 = ClaspFacade::interrupt(this_00,sig), bVar1)) {
    dVar2 = RealTime::getTime();
    shutdownTime_g = -dVar2;
    (*(this->super_Application)._vptr_Application[7])(this,"Sending shutdown signal...");
    return false;
  }
  (*(this->super_Application)._vptr_Application[7])(this,"INTERRUPTED by signal!");
  Potassco::Application::setExitCode(&this->super_Application,1);
  (*(this->super_Application)._vptr_Application[0x10])(this);
  __status = Potassco::Application::getExitCode(&this->super_Application);
  Potassco::Application::exit(&this->super_Application,__status);
  return false;
}

Assistant:

bool ClaspAppBase::onSignal(int sig) {
	if (!clasp_.get() || !clasp_->interrupt(sig)) {
		info("INTERRUPTED by signal!");
		setExitCode(E_INTERRUPT);
		shutdown();
		exit(getExitCode());
	}
	else {
		// multiple threads are active - shutdown was initiated
		shutdownTime_g = -RealTime::getTime();
		info("Sending shutdown signal...");
	}
	return false; // ignore all future signals
}